

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__rasterize(stbtt__bitmap *result,stbtt__point *pts,int *wcount,int windings,float scale_x
                     ,float scale_y,float shift_x,float shift_y,int off_x,int off_y,int invert,
                     void *userdata)

{
  int iVar1;
  stbtt__edge *p_00;
  float local_74;
  int local_70;
  int local_6c;
  int b;
  int a;
  stbtt__point *p;
  int vsubsample;
  int m;
  int k;
  int j;
  int i;
  int n;
  stbtt__edge *e;
  float y_scale_inv;
  int off_y_local;
  int off_x_local;
  float shift_y_local;
  float shift_x_local;
  float scale_y_local;
  float scale_x_local;
  int windings_local;
  int *wcount_local;
  stbtt__point *pts_local;
  stbtt__bitmap *result_local;
  
  local_74 = scale_y;
  if (invert != 0) {
    local_74 = -scale_y;
  }
  j = 0;
  for (k = 0; k < windings; k = k + 1) {
    j = wcount[k] + j;
  }
  p_00 = (stbtt__edge *)ImGui::MemAlloc((long)(j + 1) * 0x14);
  if (p_00 != (stbtt__edge *)0x0) {
    j = 0;
    p._4_4_ = 0;
    for (k = 0; k < windings; k = k + 1) {
      iVar1 = wcount[k];
      m = wcount[k] + -1;
      for (vsubsample = 0; vsubsample < wcount[k]; vsubsample = vsubsample + 1) {
        local_6c = vsubsample;
        local_70 = m;
        if ((pts[(long)p._4_4_ + (long)m].y != pts[(long)p._4_4_ + (long)vsubsample].y) ||
           (NAN(pts[(long)p._4_4_ + (long)m].y) || NAN(pts[(long)p._4_4_ + (long)vsubsample].y))) {
          p_00[j].invert = 0;
          if (invert == 0) {
            if (pts[(long)p._4_4_ + (long)m].y < pts[(long)p._4_4_ + (long)vsubsample].y)
            goto LAB_001508c7;
          }
          else if (pts[(long)p._4_4_ + (long)vsubsample].y <= pts[(long)p._4_4_ + (long)m].y &&
                   pts[(long)p._4_4_ + (long)m].y != pts[(long)p._4_4_ + (long)vsubsample].y) {
LAB_001508c7:
            p_00[j].invert = 1;
            local_6c = m;
            local_70 = vsubsample;
          }
          p_00[j].x0 = pts[(long)p._4_4_ + (long)local_6c].x * scale_x + shift_x;
          p_00[j].y0 = (pts[(long)p._4_4_ + (long)local_6c].y * local_74 + shift_y) * 1.0;
          p_00[j].x1 = pts[(long)p._4_4_ + (long)local_70].x * scale_x + shift_x;
          p_00[j].y1 = (pts[(long)p._4_4_ + (long)local_70].y * local_74 + shift_y) * 1.0;
          j = j + 1;
        }
        m = vsubsample;
      }
      p._4_4_ = iVar1 + p._4_4_;
    }
    stbtt__sort_edges(p_00,j);
    stbtt__rasterize_sorted_edges(result,p_00,j,1,off_x,off_y,userdata);
    ImGui::MemFree(p_00);
  }
  return;
}

Assistant:

static void stbtt__rasterize(stbtt__bitmap *result, stbtt__point *pts, int *wcount, int windings, float scale_x, float scale_y, float shift_x, float shift_y, int off_x, int off_y, int invert, void *userdata)
{
   float y_scale_inv = invert ? -scale_y : scale_y;
   stbtt__edge *e;
   int n,i,j,k,m;
#if STBTT_RASTERIZER_VERSION == 1
   int vsubsample = result->h < 8 ? 15 : 5;
#elif STBTT_RASTERIZER_VERSION == 2
   int vsubsample = 1;
#else
   #error "Unrecognized value of STBTT_RASTERIZER_VERSION"
#endif
   // vsubsample should divide 255 evenly; otherwise we won't reach full opacity

   // now we have to blow out the windings into explicit edge lists
   n = 0;
   for (i=0; i < windings; ++i)
      n += wcount[i];

   e = (stbtt__edge *) STBTT_malloc(sizeof(*e) * (n+1), userdata); // add an extra one as a sentinel
   if (e == 0) return;
   n = 0;

   m=0;
   for (i=0; i < windings; ++i) {
      stbtt__point *p = pts + m;
      m += wcount[i];
      j = wcount[i]-1;
      for (k=0; k < wcount[i]; j=k++) {
         int a=k,b=j;
         // skip the edge if horizontal
         if (p[j].y == p[k].y)
            continue;
         // add edge from j to k to the list
         e[n].invert = 0;
         if (invert ? p[j].y > p[k].y : p[j].y < p[k].y) {
            e[n].invert = 1;
            a=j,b=k;
         }
         e[n].x0 = p[a].x * scale_x + shift_x;
         e[n].y0 = (p[a].y * y_scale_inv + shift_y) * vsubsample;
         e[n].x1 = p[b].x * scale_x + shift_x;
         e[n].y1 = (p[b].y * y_scale_inv + shift_y) * vsubsample;
         ++n;
      }
   }

   // now sort the edges by their highest point (should snap to integer, and then by x)
   //STBTT_sort(e, n, sizeof(e[0]), stbtt__edge_compare);
   stbtt__sort_edges(e, n);

   // now, traverse the scanlines and find the intersections on each scanline, use xor winding rule
   stbtt__rasterize_sorted_edges(result, e, n, vsubsample, off_x, off_y, userdata);

   STBTT_free(e, userdata);
}